

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O3

void __thiscall SessionManager::SessionManager(SessionManager *this)

{
  MutexFactory *this_00;
  Mutex *pMVar1;
  
  this->_vptr_SessionManager = (_func_int **)&PTR__SessionManager_0019dcc8;
  (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = MutexFactory::i();
  pMVar1 = MutexFactory::getMutex(this_00);
  this->sessionsMutex = pMVar1;
  return;
}

Assistant:

SessionManager::SessionManager()
{
	sessionsMutex = MutexFactory::i()->getMutex();
}